

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlistmodel.cpp
# Opt level: O0

bool __thiscall
QStringListModel::setItemData(QStringListModel *this,QModelIndex *index,QMap<int,_QVariant> *roles)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  key_iterator kVar4;
  key_iterator kVar5;
  QVariant *pQVar6;
  int *piVar7;
  undefined8 in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  const_iterator roleIter;
  QMap<int,_QVariant> *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  bool local_2d;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QMap<int,_QVariant>::isEmpty
                    ((QMap<int,_QVariant> *)
                     CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  if (bVar2) {
    local_2d = false;
  }
  else {
    kVar4 = QMap<int,_QVariant>::keyBegin
                      ((QMap<int,_QVariant> *)
                       CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
    kVar5 = QMap<int,_QVariant>::keyEnd
                      ((QMap<int,_QVariant> *)
                       CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
    bVar2 = std::
            any_of<QMap<int,QVariant>::key_iterator,QStringListModel::setItemData(QModelIndex_const&,QMap<int,QVariant>const&)::__0>
                      (kVar4.i.i._M_node,kVar5.i.i._M_node);
    if (bVar2) {
      local_2d = false;
    }
    else {
      QMap<int,_QVariant>::constFind(in_stack_ffffffffffffff78,(int *)0x8baccf);
      QMap<int,_QVariant>::constEnd(in_stack_ffffffffffffff78);
      bVar2 = ::operator==((const_iterator *)
                           CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                           (const_iterator *)in_stack_ffffffffffffff78);
      if (bVar2) {
        QMap<int,_QVariant>::constFind(in_stack_ffffffffffffff78,(int *)0x8bad0f);
      }
      pQVar6 = QMap<int,_QVariant>::const_iterator::value((const_iterator *)0x8bad32);
      piVar7 = QMap<int,_QVariant>::const_iterator::key((const_iterator *)0x8bad41);
      bVar3 = (**(code **)(*in_RDI + 0x98))(in_RDI,in_RSI,pQVar6,*piVar7);
      local_2d = (bool)(bVar3 & 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_2d;
}

Assistant:

bool QStringListModel::setItemData(const QModelIndex &index, const QMap<int, QVariant> &roles)
{
    if (roles.isEmpty())
        return false;
    if (std::any_of(roles.keyBegin(), roles.keyEnd(), [](int role) -> bool {
        return role != Qt::DisplayRole && role != Qt::EditRole;
    })) {
        return false;
    }
    auto roleIter = roles.constFind(Qt::EditRole);
    if (roleIter == roles.constEnd())
        roleIter = roles.constFind(Qt::DisplayRole);
    Q_ASSERT(roleIter != roles.constEnd());
    return setData(index, roleIter.value(), roleIter.key());
}